

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O0

string * fs_get_homedir_abi_cxx11_(void)

{
  _Bool _Var1;
  bool bVar2;
  char *__str;
  string *in_RDI;
  __sv_type in;
  string_view local_40;
  undefined1 local_30 [8];
  string home;
  
  _Var1 = fs_is_windows();
  __str = "HOME";
  if (_Var1) {
    __str = "USERPROFILE";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,__str);
  fs_getenv_abi_cxx11_((string *)local_30,local_40);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  if (bVar2) {
    fs_get_profile_dir_abi_cxx11_();
  }
  else {
    in = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    fs_drop_slash_abi_cxx11_(in_RDI,in);
  }
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string fs_get_homedir()
{
  // has no trailing slash
  std::string home = fs_getenv(fs_is_windows() ? "USERPROFILE" : "HOME");

  return home.empty() ? fs_get_profile_dir() : fs_drop_slash(home);
}